

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<int> * __thiscall QList<int>::fill(QList<int> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int copy;
  ulong uVar10;
  long in_FS_OFFSET;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  lVar7 = newSize;
  if (pDVar1 != (Data *)0x0) {
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1 == (Data *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = (pDVar1->super_QArrayData).alloc;
      }
      if (newSize <= lVar8) {
        lVar7 = (this->d).size;
        if (newSize <= lVar7) {
          lVar7 = newSize;
        }
        if (lVar7 != 0) {
          piVar6 = (this->d).ptr;
          lVar8 = 0;
          do {
            *(parameter_type *)((long)piVar6 + lVar8) = t;
            lVar8 = lVar8 + 4;
          } while (lVar7 * 4 != lVar8);
        }
        lVar7 = (this->d).size;
        lVar8 = newSize - lVar7;
        if (lVar8 == 0 || newSize < lVar7) {
          if (newSize < lVar7) {
            (this->d).size = newSize;
          }
        }
        else {
          piVar6 = (this->d).ptr;
          (this->d).size = newSize;
          auVar5 = _DAT_00118040;
          auVar4 = _DAT_00118030;
          auVar3 = _DAT_00118020;
          lVar9 = lVar8 + -1;
          auVar15._8_4_ = (int)lVar9;
          auVar15._0_8_ = lVar9;
          auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
          uVar10 = 0;
          auVar15 = auVar15 ^ _DAT_00118040;
          do {
            auVar14._8_4_ = (int)uVar10;
            auVar14._0_8_ = uVar10;
            auVar14._12_4_ = (int)(uVar10 >> 0x20);
            auVar11 = (auVar14 | auVar4) ^ auVar5;
            iVar12 = auVar15._4_4_;
            if ((bool)(~(auVar11._4_4_ == iVar12 && auVar15._0_4_ < auVar11._0_4_ ||
                        iVar12 < auVar11._4_4_) & 1)) {
              piVar6[lVar7 + uVar10] = t;
            }
            if ((auVar11._12_4_ != auVar15._12_4_ || auVar11._8_4_ <= auVar15._8_4_) &&
                auVar11._12_4_ <= auVar15._12_4_) {
              piVar6[lVar7 + uVar10 + 1] = t;
            }
            auVar14 = (auVar14 | auVar3) ^ auVar5;
            iVar16 = auVar14._4_4_;
            if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar14._0_4_ <= auVar15._0_4_)) {
              piVar6[lVar7 + uVar10 + 2] = t;
              piVar6[lVar7 + uVar10 + 3] = t;
            }
            uVar10 = uVar10 + 4;
          } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar10);
        }
        goto LAB_00104705;
      }
    }
    if (pDVar1 != (Data *)0x0) {
      lVar7 = (pDVar1->super_QArrayData).alloc;
      if (lVar7 <= newSize) {
        lVar7 = newSize;
      }
      if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar7 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  piVar6 = (int *)QArrayData::allocate(&local_30,4,0x10,lVar7,KeepSize);
  auVar5 = _DAT_00118040;
  auVar4 = _DAT_00118030;
  auVar3 = _DAT_00118020;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    lVar7 = newSize + -1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_00118040;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar13 | auVar4) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar12 < auVar15._4_4_) & 1)) {
        piVar6[uVar10] = t;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        piVar6[uVar10 + 1] = t;
      }
      auVar15 = (auVar13 | auVar3) ^ auVar5;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
        piVar6[uVar10 + 2] = t;
        piVar6[uVar10 + 3] = t;
      }
      uVar10 = uVar10 + 4;
    } while ((newSize + 3U & 0xfffffffffffffffc) != uVar10);
  }
  pQVar2 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = piVar6;
  (this->d).size = newSize;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,4,0x10);
    }
  }
LAB_00104705:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}